

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O0

Vector __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getMomentaDotFromKinematics
          (ModelBaseEKFFlexEstimatorIMU *this)

{
  Vector *u;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar1;
  long *in_RSI;
  Vector VVar2;
  undefined1 local_68 [8];
  Vector6 v;
  Matrix<double,__1,_1,_0,__1,_1> local_28;
  ModelBaseEKFFlexEstimatorIMU *this_local;
  
  this_local = this;
  if ((*(byte *)(in_RSI + 0x2d0) & 1) == 1) {
    u = (Vector *)(**(code **)(*in_RSI + 0x80))();
    (**(code **)(*in_RSI + 0x70))();
    IMUElasticLocalFrameDynamicalSystem::getMomentaDotFromKinematics
              ((IMUElasticLocalFrameDynamicalSystem *)this,(Vector *)(in_RSI + 0x6c),u);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_28);
    IVar1 = extraout_RDX;
  }
  else {
    Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_68);
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_68);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,6,1,0,6,1>>
              ((Matrix<double,_1,1,0,_1,1> *)this,
               (EigenBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_68);
    IVar1 = extraout_RDX_00;
  }
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar1;
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector ModelBaseEKFFlexEstimatorIMU::getMomentaDotFromKinematics()
{
  if(on_ == true)
  {
    return functor_.getMomentaDotFromKinematics(getFlexibilityVector(), getInput());
  }
  else
  {
    Vector6 v;
    v.setZero();
    return v;
  }
}